

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

void __thiscall
mxx::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
future(future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this)

{
  pointer __p;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  impl::
  future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  future_base(&this->
               super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  (this->
  super_future_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_future_base = (_func_int **)&PTR__future_00295978;
  __p = (pointer)operator_new(0x20);
  std::__cxx11::string::string((string *)__p);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->m_data,__p);
  return;
}

Assistant:

future() : impl::future_base<T>(), m_data(new T()) {}